

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O2

void __thiscall
cmTargetLinkLibrariesCommand::LinkLibraryTypeSpecifierWarning
          (cmTargetLinkLibrariesCommand *this,int left,int right)

{
  cmMakefile *this_00;
  ostream *poVar1;
  ostringstream w;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"Link library type specifier \"");
  poVar1 = std::operator<<(poVar1,LinkLibraryTypeNames[left]);
  poVar1 = std::operator<<(poVar1,"\" is followed by specifier \"");
  poVar1 = std::operator<<(poVar1,LinkLibraryTypeNames[right]);
  poVar1 = std::operator<<(poVar1,"\" instead of a library name.  ");
  std::operator<<(poVar1,"The first specifier will be ignored.");
  this_00 = (this->super_cmCommand).Makefile;
  std::__cxx11::stringbuf::str();
  cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&sStack_1b8);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void cmTargetLinkLibrariesCommand::LinkLibraryTypeSpecifierWarning(int left,
                                                                   int right)
{
  std::ostringstream w;
  w << "Link library type specifier \""
    << cmTargetLinkLibrariesCommand::LinkLibraryTypeNames[left]
    << "\" is followed by specifier \""
    << cmTargetLinkLibrariesCommand::LinkLibraryTypeNames[right]
    << "\" instead of a library name.  "
    << "The first specifier will be ignored.";
  this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
}